

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void * __thiscall
c4::MemoryResourceLinear::do_reallocate
          (MemoryResourceLinear *this,void *ptr,size_t oldsz,size_t newsz,size_t alignment)

{
  ulong in_RCX;
  ulong in_RDX;
  void *in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  bool bVar1;
  bool same_pos;
  char *cptr;
  void *local_8;
  
  local_8 = in_RSI;
  if (in_RCX != in_RDX) {
    bVar1 = in_RDI[3] + in_RDI[5] == (long)in_RSI + in_RDX;
    if (in_RCX < in_RDX) {
      if (bVar1) {
        in_RDI[5] = in_RDI[5] - (in_RDX - in_RCX);
      }
    }
    else if ((bVar1) && ((long)in_RSI + in_RCX <= (ulong)(in_RDI[3] + in_RDI[4]))) {
      in_RDI[5] = (in_RCX - in_RDX) + in_RDI[5];
    }
    else {
      local_8 = (void *)(**(code **)(*in_RDI + 0x10))(in_RDI,in_RCX,in_R8,in_RSI);
    }
  }
  return local_8;
}

Assistant:

void* MemoryResourceLinear::do_reallocate(void* ptr, size_t oldsz, size_t newsz, size_t alignment)
{
    if(newsz == oldsz) return ptr;
    // is ptr the most recently allocated (MRA) block?
    char *cptr = (char*)ptr;
    bool same_pos = (m_mem + m_pos == cptr + oldsz);
    // no need to get more memory when shrinking
    if(newsz < oldsz)
    {
        // if this is the MRA, we can safely shrink the position
        if(same_pos)
        {
            m_pos -= oldsz - newsz;
        }
        return ptr;
    }
    // we're growing the block, and it fits in size
    else if(same_pos && cptr + newsz <= m_mem + m_size)
    {
        // if this is the MRA, we can safely shrink the position
        m_pos += newsz - oldsz;
        return ptr;
    }
    // we're growing the block or it doesn't fit -
    // delegate any of these situations to do_deallocate()
    return do_allocate(newsz, alignment, ptr);
}